

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_write_indicator
              (yaml_emitter_t *emitter,char *indicator,int need_whitespace,int is_whitespace,
              int is_indention)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  yaml_char_t *pyVar5;
  byte *pbVar6;
  
  sVar4 = strlen(indicator);
  if ((need_whitespace != 0) && (emitter->whitespace == 0)) {
    pyVar5 = (emitter->buffer).pointer;
    if ((emitter->buffer).end <= pyVar5 + 5) {
      iVar3 = yaml_emitter_flush(emitter);
      if (iVar3 == 0) {
        return 0;
      }
      pyVar5 = (emitter->buffer).pointer;
    }
    (emitter->buffer).pointer = pyVar5 + 1;
    *pyVar5 = ' ';
    emitter->column = emitter->column + 1;
  }
  if (sVar4 != 0) {
    pbVar6 = (byte *)(indicator + sVar4);
    do {
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) {
        return 0;
      }
      bVar2 = *indicator;
      if ((char)bVar2 < '\0') {
        if ((bVar2 & 0xe0) == 0xc0) {
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = ((byte *)indicator)[1];
          indicator = (char *)((byte *)indicator + 2);
          goto LAB_00108764;
        }
        if ((bVar2 & 0xf0) == 0xe0) {
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = ((byte *)indicator)[1];
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = ((byte *)indicator)[2];
          indicator = (char *)((byte *)indicator + 3);
          goto LAB_00108764;
        }
        if ((bVar2 & 0xf8) == 0xf0) {
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = ((byte *)indicator)[1];
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = ((byte *)indicator)[2];
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = ((byte *)indicator)[3];
          indicator = (char *)((byte *)indicator + 4);
          goto LAB_00108764;
        }
      }
      else {
        indicator = (char *)((byte *)indicator + 1);
LAB_00108764:
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
      }
      emitter->column = emitter->column + 1;
    } while ((byte *)indicator != pbVar6);
  }
  emitter->whitespace = is_whitespace;
  emitter->indention = (uint)(is_indention != 0 && emitter->indention != 0);
  emitter->open_ended = 0;
  return 1;
}

Assistant:

static int
yaml_emitter_write_indicator(yaml_emitter_t *emitter,
        const char *indicator, int need_whitespace,
        int is_whitespace, int is_indention)
{
    size_t indicator_length;
    yaml_string_t string;

    indicator_length = strlen(indicator);
    STRING_ASSIGN(string, (yaml_char_t *)indicator, indicator_length);

    if (need_whitespace && !emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (!WRITE(emitter, string)) return 0;
    }

    emitter->whitespace = is_whitespace;
    emitter->indention = (emitter->indention && is_indention);
    emitter->open_ended = 0;

    return 1;
}